

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wat-writer.cc
# Opt level: O2

void __thiscall
wabt::anon_unknown_1::WatWriter::WriteName(WatWriter *this,string_view str,NextChar next_char)

{
  undefined1 auVar1 [8];
  char *pcVar2;
  const_reference pcVar3;
  byte bVar4;
  long lVar5;
  byte *pbVar6;
  long lVar7;
  long lVar8;
  char *pcVar9;
  size_type *local_78;
  string valid_str;
  undefined1 local_50 [8];
  string_view str_local;
  
  str_local.data_ = (char *)str.size_;
  local_50 = (undefined1  [8])str.data_;
  if ((str_local.data_ == (char *)0x0) ||
     (pcVar3 = string_view::front((string_view *)local_50), pcVar2 = str_local.data_,
     auVar1 = local_50, *pcVar3 != '$')) {
    __assert_fail("!str.empty() && str.front() == \'$\'",
                  "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/wabt/src/wat-writer.cc"
                  ,0x14f,
                  "void wabt::(anonymous namespace)::WatWriter::WriteName(string_view, NextChar)");
  }
  lVar8 = 0;
  lVar7 = 0;
  for (lVar5 = (long)str_local.data_ >> 2; str_local.size_._4_4_ = next_char, 0 < lVar5;
      lVar5 = lVar5 + -1) {
    if ((anonymous_namespace)::s_valid_name_chars[*(byte *)((long)local_50 + lVar8 * 4)] == '\0') {
      pbVar6 = (byte *)((long)local_50 + -lVar7);
      goto LAB_00db1bda;
    }
    if ((anonymous_namespace)::s_valid_name_chars[*(byte *)((long)local_50 + lVar8 * 4 + 1)] == '\0'
       ) {
      pbVar6 = (byte *)((long)local_50 + (1 - lVar7));
      goto LAB_00db1bda;
    }
    if ((anonymous_namespace)::s_valid_name_chars[*(byte *)((long)local_50 + lVar8 * 4 + 2)] == '\0'
       ) {
      pbVar6 = (byte *)((long)local_50 + (2 - lVar7));
      goto LAB_00db1bda;
    }
    if ((anonymous_namespace)::s_valid_name_chars[*(byte *)((long)local_50 + lVar8 * 4 + 3)] == '\0'
       ) {
      pbVar6 = (byte *)((long)local_50 + (3 - lVar7));
      goto LAB_00db1bda;
    }
    lVar7 = lVar7 + -4;
    lVar8 = lVar8 + 1;
  }
  pbVar6 = (byte *)((long)local_50 + -lVar7);
  pcVar9 = str_local.data_ + lVar7;
  if (pcVar9 == &DAT_00000001) {
LAB_00db1c73:
    if ((anonymous_namespace)::s_valid_name_chars[*pbVar6] == '\0') goto LAB_00db1bda;
  }
  else {
    if (pcVar9 == (char *)0x3) {
      if ((anonymous_namespace)::s_valid_name_chars[*(byte *)((long)local_50 + lVar8 * 4)] != '\0')
      {
        pbVar6 = (byte *)((long)local_50 + (1 - lVar7));
        goto LAB_00db1c63;
      }
    }
    else {
      if (pcVar9 != (char *)0x2) goto LAB_00db1c80;
LAB_00db1c63:
      if ((anonymous_namespace)::s_valid_name_chars[*pbVar6] != '\0') {
        pbVar6 = pbVar6 + 1;
        goto LAB_00db1c73;
      }
    }
LAB_00db1bda:
    if (pbVar6 != (byte *)((long)local_50 + (long)str_local.data_)) {
      local_78 = &valid_str._M_string_length;
      valid_str._M_dataplus._M_p = (pointer)0x0;
      valid_str._M_string_length._0_1_ = 0;
      valid_str.field_2._8_8_ = this;
      for (pcVar9 = (char *)0x0; this = (WatWriter *)valid_str.field_2._8_8_, pcVar2 != pcVar9;
          pcVar9 = pcVar9 + 1) {
        bVar4 = 0x5f;
        if ((anonymous_namespace)::s_valid_name_chars[*(byte *)((long)auVar1 + (long)pcVar9)] !=
            '\0') {
          bVar4 = *(byte *)((long)auVar1 + (long)pcVar9);
        }
        std::__cxx11::string::push_back((string *)&local_78,bVar4);
      }
      WriteDataWithNextChar
                ((WatWriter *)valid_str.field_2._8_8_,local_78,(size_t)valid_str._M_dataplus._M_p);
      std::__cxx11::string::~string((string *)&local_78);
      goto LAB_00db1c8f;
    }
  }
LAB_00db1c80:
  WriteDataWithNextChar(this,(void *)local_50,(size_t)str_local.data_);
LAB_00db1c8f:
  this->next_char_ = str_local.size_._4_4_;
  return;
}

Assistant:

void WatWriter::WriteName(string_view str, NextChar next_char) {
  // Debug names must begin with a $ for for wast file to be valid
  assert(!str.empty() && str.front() == '$');
  bool has_invalid_chars = std::any_of(
      str.begin(), str.end(), [](uint8_t c) { return !s_valid_name_chars[c]; });

  if (has_invalid_chars) {
    std::string valid_str;
    std::transform(str.begin(), str.end(), std::back_inserter(valid_str),
                   [](uint8_t c) { return s_valid_name_chars[c] ? c : '_'; });
    WriteDataWithNextChar(valid_str.data(), valid_str.length());
  } else {
    WriteDataWithNextChar(str.data(), str.length());
  }

  next_char_ = next_char;
}